

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O2

int __thiscall ncnn::Convolution1D_x86::create_pipeline(Convolution1D_x86 *this,Option *opt)

{
  uint _c;
  _func_int *p_Var1;
  int iVar2;
  void *pvVar3;
  int _h;
  ulong uVar4;
  int j;
  int iVar5;
  ulong uVar6;
  int k;
  long lVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  undefined4 *puVar13;
  Mat g0;
  Mat local_c0;
  Mat weight_data_r2;
  
  p_Var1 = this->_vptr_Convolution1D_x86[-3];
  if (*(int *)(&this->field_0x140 + (long)p_Var1) == 0) {
    _c = *(uint *)(&this->field_0xd0 + (long)p_Var1);
    uVar6 = (long)*(int *)(&this->field_0xf0 + (long)p_Var1) /
            (long)*(int *)(&this->field_0xd4 + (long)p_Var1);
    uVar6 = (long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) / (long)(int)_c;
    _h = (int)uVar6;
    if (opt->use_packing_layout == true) {
      uVar9 = (ulong)((uint)((uVar6 & 3) == 0) * 3 + 1);
      uVar12 = (ulong)((uint)((_c & 3) == 0) * 3 + 1);
    }
    else {
      uVar9 = 1;
      uVar12 = 1;
    }
    Mat::reshape(&weight_data_r2,(Mat *)(&this->field_0x148 + (long)p_Var1),
                 *(int *)(&this->field_0xd4 + (long)p_Var1),_h,_c,(Allocator *)0x0);
    iVar8 = (int)uVar9;
    iVar11 = (int)uVar12;
    Mat::create(&this->weight_data_packed,
                *(int *)(&this->field_0xd4 + (long)this->_vptr_Convolution1D_x86[-3]),
                (int)((long)((ulong)(uint)(_h >> 0x1f) << 0x20 | uVar6 & 0xffffffff) / (long)iVar8),
                *(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86[-3]) / iVar11,
                (ulong)(uint)(iVar11 * iVar8 * 4),iVar11 * iVar8,(Allocator *)0x0);
    uVar6 = 0;
    while (iVar2 = (int)uVar6,
          iVar11 + -1 + iVar2 <
          *(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86[-3])) {
      Mat::channel(&g0,&this->weight_data_packed,(int)(uVar6 / uVar12));
      for (uVar6 = 0; (long)uVar6 < (long)((long)_h - (ulong)(iVar8 - 1)); uVar6 = uVar6 + uVar9) {
        puVar13 = (undefined4 *)
                  (((uVar6 & 0xffffffff) / uVar9) * (long)g0.w * g0.elemsize + (long)g0.data);
        for (lVar7 = 0;
            lVar7 < *(int *)(&this->field_0xd4 + (long)this->_vptr_Convolution1D_x86[-3]);
            lVar7 = lVar7 + 1) {
          for (uVar4 = 0; uVar4 != uVar9; uVar4 = uVar4 + 1) {
            for (iVar5 = 0; iVar11 != iVar5; iVar5 = iVar5 + 1) {
              Mat::channel(&local_c0,&weight_data_r2,iVar2 + iVar5);
              pvVar3 = local_c0.data;
              lVar10 = (long)local_c0.w * (uVar4 + uVar6) * local_c0.elemsize;
              Mat::~Mat(&local_c0);
              *puVar13 = *(undefined4 *)((long)pvVar3 + lVar7 * 4 + lVar10);
              puVar13 = puVar13 + 1;
            }
          }
        }
      }
      Mat::~Mat(&g0);
      uVar6 = (ulong)(uint)(iVar2 + iVar11);
    }
    Mat::~Mat(&weight_data_r2);
  }
  return 0;
}

Assistant:

int Convolution1D_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-inch-outch
    // dst = pb-pa-kw-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(kernel_w, num_input, num_output);

        weight_data_packed.create(kernel_w, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            Mat g0 = weight_data_packed.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                float* g00 = g0.row(p / elempack);

                for (int k = 0; k < kernel_w; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    return 0;
}